

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

int __thiscall deqp::egl::BufferAgeTests::init(BufferAgeTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  undefined8 oddFrameDrawType_00;
  byte bVar2;
  int extraout_EAX;
  TestCaseGroup *pTVar3;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *pvVar4;
  reference oddFrameDrawType_01;
  BufferAgeTest *this_00;
  ResizeType resizeType_00;
  char *pcVar5;
  undefined1 local_1c8 [8];
  string name;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *oddFrameDrawType;
  size_t oddNdx;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *evenFrameDrawType;
  size_t evenNdx;
  string local_180;
  TestCaseGroup *local_160;
  TestCaseGroup *resizeGroup;
  ulong uStack_150;
  ResizeType resizeType;
  size_t resizeTypeNdx;
  TestCaseGroup *preserveGroup;
  int local_138;
  bool preserve;
  int preserveNdx;
  allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> local_111;
  value_type local_110;
  allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> local_f5;
  value_type local_f4;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  local_f0;
  allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> local_d5;
  value_type local_d4;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  local_d0;
  allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> local_b5;
  value_type local_b4;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  local_b0;
  allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> local_95;
  value_type local_94;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  local_90;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  local_68;
  undefined1 local_48 [8];
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  frameDrawTypes;
  ResizeType resizeTypes [3];
  DrawType renderClear [2];
  DrawType clearRender [2];
  BufferAgeTests *this_local;
  
  renderClear[0] = DRAWTYPE_GLES2_CLEAR;
  renderClear[1] = DRAWTYPE_GLES2_RENDER;
  stack0xffffffffffffffe0 = 1;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
  resizeTypes[0] = RESIZETYPE_AFTER_SWAP;
  clearRender = (DrawType  [2])this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::vector((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
            *)local_48);
  local_68.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector(&local_68);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_68);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_68);
  local_94 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator(&local_95);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector(&local_90,1,&local_94,&local_95);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_90);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_90);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator(&local_95);
  local_b4 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator(&local_b5);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector(&local_b0,1,&local_b4,&local_b5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_b0);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_b0);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator(&local_b5);
  local_d4 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator(&local_d5);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector(&local_d0,2,&local_d4,&local_d5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_d0);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_d0);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator(&local_d5);
  local_f4 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator(&local_f5);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector(&local_f0,2,&local_f4,&local_f5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_f0);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_f0);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator(&local_f5);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator(&local_111);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_110,renderClear,clearRender,&local_111);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,&local_110);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector(&local_110);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator(&local_111);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::allocator
            ((allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> *)&preserve);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&preserveNdx,resizeTypes + 2,renderClear,
             (allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> *)&preserve);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               *)local_48,(value_type *)&preserveNdx);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
             *)&preserveNdx);
  std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>::~allocator
            ((allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType> *)&preserve);
  for (local_138 = 0; local_138 < 2; local_138 = local_138 + 1) {
    preserveGroup._7_1_ = local_138 == 0;
    pTVar3 = (TestCaseGroup *)operator_new(0x78);
    pcVar5 = "no_preserve";
    if ((preserveGroup._7_1_ & 1) != 0) {
      pcVar5 = "preserve";
    }
    TestCaseGroup::TestCaseGroup(pTVar3,(this->super_TestCaseGroup).m_eglTestCtx,pcVar5,"");
    resizeTypeNdx = (size_t)pTVar3;
    for (uStack_150 = 0; uStack_150 < 3; uStack_150 = uStack_150 + 1) {
      resizeGroup._4_4_ = resizeTypes[uStack_150 - 2];
      pTVar3 = (TestCaseGroup *)operator_new(0x78);
      pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
      egl::(anonymous_namespace)::generateResizeGroupName_abi_cxx11_
                (&local_180,(_anonymous_namespace_ *)(ulong)resizeGroup._4_4_,resizeType_00);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(pTVar3,pEVar1,pcVar5,"");
      std::__cxx11::string::~string((string *)&local_180);
      evenFrameDrawType =
           (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            *)0x0;
      local_160 = pTVar3;
      while( true ) {
        pvVar4 = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  *)std::
                    vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                    ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                            *)local_48);
        if (pvVar4 <= evenFrameDrawType) break;
        oddFrameDrawType_01 =
             std::
             vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
             ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                           *)local_48,(size_type)evenFrameDrawType);
        oddFrameDrawType = evenFrameDrawType;
        while( true ) {
          pvVar4 = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    *)std::
                      vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                      ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                              *)local_48);
          if (pvVar4 <= oddFrameDrawType) break;
          name.field_2._8_8_ =
               std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                             *)local_48,(size_type)oddFrameDrawType);
          egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                    ((string *)local_1c8,(_anonymous_namespace_ *)name.field_2._8_8_,
                     oddFrameDrawType_01,pvVar4);
          pTVar3 = local_160;
          this_00 = (BufferAgeTest *)operator_new(0x1b18);
          bVar2 = preserveGroup._7_1_;
          oddFrameDrawType_00 = name.field_2._8_8_;
          pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          egl::anon_unknown_0::BufferAgeTest::BufferAgeTest
                    (this_00,pEVar1,(bool)(bVar2 & 1),
                     (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                      *)oddFrameDrawType_00,oddFrameDrawType_01,RESIZETYPE_NONE,pcVar5,"");
          tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_00);
          std::__cxx11::string::~string((string *)local_1c8);
          oddFrameDrawType =
               (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                *)((long)&(oddFrameDrawType->
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
        }
        evenFrameDrawType =
             (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              *)((long)&(evenFrameDrawType->
                        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      tcu::TestNode::addChild((TestNode *)resizeTypeNdx,(TestNode *)local_160);
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)resizeTypeNdx);
  }
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::~vector((vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
             *)local_48);
  return extraout_EAX;
}

Assistant:

void BufferAgeTests::init (void)
{
	const BufferAgeTest::DrawType clearRender[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR,
		BufferAgeTest::DRAWTYPE_GLES2_RENDER
	};

	const BufferAgeTest::DrawType renderClear[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_RENDER,
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR
	};

	const BufferAgeTest::ResizeType resizeTypes[] =
	{
		BufferAgeTest::RESIZETYPE_NONE,
		BufferAgeTest::RESIZETYPE_BEFORE_SWAP,
		BufferAgeTest::RESIZETYPE_AFTER_SWAP
	};

	vector< vector<BufferAgeTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> ());
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
		{
			const BufferAgeTest::ResizeType	resizeType	= resizeTypes[resizeTypeNdx];
			TestCaseGroup* const			resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

			for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
			{
				const vector<BufferAgeTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

				for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
				{
					const vector<BufferAgeTest::DrawType>&	oddFrameDrawType	= frameDrawTypes[oddNdx];
					const std::string						name				= generateTestName(oddFrameDrawType, evenFrameDrawType);
					resizeGroup->addChild(new BufferAgeTest(m_eglTestCtx, preserve, oddFrameDrawType, evenFrameDrawType, BufferAgeTest::RESIZETYPE_NONE, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(resizeGroup);
		}
		addChild(preserveGroup);
	}
}